

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O2

void __thiscall
RegisterCleanTestCleanDepFileOnCleanRule::RegisterCleanTestCleanDepFileOnCleanRule
          (RegisterCleanTestCleanDepFileOnCleanRule *this)

{
  RegisterTest(CleanTestCleanDepFileOnCleanRule::Create,"CleanTest.CleanDepFileOnCleanRule");
  return;
}

Assistant:

TEST_F(CleanTest, CleanDepFileOnCleanRule) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc $in > $out\n"
"  depfile = $out.d\n"
"build out1: cc in1\n"));
  fs_.Create("out1", "");
  fs_.Create("out1.d", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanRule("cc"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}